

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O2

int CVodeQuadSensSStolerances(void *cvode_mem,sunrealtype reltolQS,sunrealtype *abstolQS)

{
  double *pdVar1;
  double dVar2;
  ulong uVar3;
  void *pvVar4;
  ulong uVar5;
  int line;
  uint uVar6;
  int error_code;
  char *msgfmt;
  long lVar7;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    error_code = -0x15;
    cvode_mem = (CVodeMem)0x0;
    line = 0x97c;
  }
  else if (*(int *)((long)cvode_mem + 0x860) == 0) {
    msgfmt = "Forward sensitivity analysis not activated.";
    error_code = -0x28;
    line = 0x985;
  }
  else {
    if (*(int *)((long)cvode_mem + 0x86c) == 0) {
      cvProcessError((CVodeMem)cvode_mem,-0x32,0x98e,"CVodeQuadSensSStolerances",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                     ,"Forward sensitivity analysis for quadrature variables not activated.");
      return -0x1e;
    }
    if (0.0 <= reltolQS) {
      if (abstolQS == (sunrealtype *)0x0) {
        msgfmt = "abstolQS = NULL illegal.";
        error_code = -0x16;
        line = 0x99e;
      }
      else {
        uVar6 = *(uint *)((long)cvode_mem + 0x90);
        lVar7 = (long)(int)uVar6;
        uVar3 = 0;
        uVar5 = 0;
        if (0 < (int)uVar6) {
          uVar5 = (ulong)uVar6;
        }
        do {
          if (uVar5 == uVar3) {
            *(undefined4 *)((long)cvode_mem + 0x128) = 1;
            *(sunrealtype *)((long)cvode_mem + 0x130) = reltolQS;
            if (*(int *)((long)cvode_mem + 0x868) == 0) {
              pvVar4 = malloc(lVar7 * 8);
              *(void **)((long)cvode_mem + 0x138) = pvVar4;
              pvVar4 = malloc(lVar7 * 4);
              *(void **)((long)cvode_mem + 0x148) = pvVar4;
              *(long *)((long)cvode_mem + 0x718) = *(long *)((long)cvode_mem + 0x718) + lVar7;
              *(undefined4 *)((long)cvode_mem + 0x868) = 1;
            }
            for (lVar7 = 0; lVar7 < (int)uVar6; lVar7 = lVar7 + 1) {
              dVar2 = abstolQS[lVar7];
              *(double *)(*(long *)((long)cvode_mem + 0x138) + lVar7 * 8) = dVar2;
              *(uint *)(*(long *)((long)cvode_mem + 0x148) + lVar7 * 4) = -(uint)(dVar2 == 0.0) & 1;
              uVar6 = *(uint *)((long)cvode_mem + 0x90);
            }
            return 0;
          }
          pdVar1 = abstolQS + uVar3;
          uVar3 = uVar3 + 1;
        } while (0.0 < *pdVar1 || *pdVar1 == 0.0);
        msgfmt = "abstolQS has negative component(s) (illegal).";
        error_code = -0x16;
        line = 0x9a7;
      }
    }
    else {
      msgfmt = "reltolQS < 0 illegal.";
      error_code = -0x16;
      line = 0x997;
    }
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,line,"CVodeQuadSensSStolerances",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                 ,msgfmt);
  return error_code;
}

Assistant:

int CVodeQuadSensSStolerances(void* cvode_mem, sunrealtype reltolQS,
                              sunrealtype* abstolQS)
{
  CVodeMem cv_mem;
  int is;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* Check if sensitivity was initialized */

  if (cv_mem->cv_SensMallocDone == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_SENS, __LINE__, __func__, __FILE__,
                   MSGCV_NO_SENSI);
    return (CV_NO_SENS);
  }

  /* Ckeck if quadrature sensitivity was initialized? */

  if (cv_mem->cv_QuadSensMallocDone == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_QUADSENS, __LINE__, __func__, __FILE__,
                   MSGCV_NO_QUADSENSI);
    return (CV_NO_QUAD);
  }

  /* Test user-supplied tolerances */

  if (reltolQS < ZERO)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_BAD_RELTOLQS);
    return (CV_ILL_INPUT);
  }

  if (abstolQS == NULL)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_NULL_ABSTOLQS);
    return (CV_ILL_INPUT);
  }

  for (is = 0; is < cv_mem->cv_Ns; is++)
  {
    if (abstolQS[is] < ZERO)
    {
      cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                     MSGCV_BAD_ABSTOLQS);
      return (CV_ILL_INPUT);
    }
  }

  /* Copy tolerances into memory */

  cv_mem->cv_itolQS = CV_SS;

  cv_mem->cv_reltolQS = reltolQS;

  if (!(cv_mem->cv_SabstolQSMallocDone))
  {
    cv_mem->cv_SabstolQS = NULL;
    cv_mem->cv_SabstolQS =
      (sunrealtype*)malloc(cv_mem->cv_Ns * sizeof(sunrealtype));
    cv_mem->cv_atolQSmin0 =
      (sunbooleantype*)malloc(cv_mem->cv_Ns * sizeof(sunbooleantype));
    cv_mem->cv_lrw += cv_mem->cv_Ns;
    cv_mem->cv_SabstolQSMallocDone = SUNTRUE;
  }

  for (is = 0; is < cv_mem->cv_Ns; is++)
  {
    cv_mem->cv_SabstolQS[is]  = abstolQS[is];
    cv_mem->cv_atolQSmin0[is] = (abstolQS[is] == ZERO);
  }

  return (CV_SUCCESS);
}